

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

void Abc_TgInitMan(Abc_TgMan_t *pMan,word *pTruth,int nVars,int nAlg,Vec_Int_t *vPhase)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  
  pMan->pTruth = pTruth;
  pMan->fPhased = 0;
  pMan->nGVars = nVars;
  pMan->nVars = nVars;
  pMan->nGroups = 1;
  pMan->uPhase = 0;
  pMan->pGroup[0].iStart = '\0';
  pMan->pGroup[0].nGVars = (char)nVars;
  if (nVars < 1) {
    uVar1 = 0;
  }
  else {
    uVar1 = (ulong)(uint)nVars;
    uVar3 = 0;
    do {
      cVar2 = (char)uVar3;
      pMan->pPerm[uVar3] = cVar2;
      pMan->pPermT[uVar3] = cVar2;
      pMan->pPermTRev[uVar3] = cVar2;
      pMan->symPhase[uVar3] = '\x01';
      pMan->symLink[uVar3] = -1;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  pMan->symLink[uVar1] = -1;
  pMan->nAlgorithm = nAlg;
  pMan->vPhase = vPhase;
  vPhase->nSize = 0;
  return;
}

Assistant:

static void Abc_TgInitMan(Abc_TgMan_t * pMan, word * pTruth, int nVars, int nAlg, Vec_Int_t * vPhase)
{
    int i;
    pMan->pTruth = pTruth;
    pMan->uPhase = 0;
    pMan->fPhased = 0;
    pMan->nVars = pMan->nGVars = nVars;
    pMan->nGroups = 1;
    pMan->pGroup[0].iStart = 0;
    pMan->pGroup[0].nGVars = nVars;
    for (i = 0; i < nVars; i++)
    {
        pMan->pPerm[i] = i;
        pMan->pPermT[i] = i;
        pMan->pPermTRev[i] = i;
        pMan->symPhase[i] = 1;
        pMan->symLink[i] = -1;
    }
    pMan->symLink[i] = -1;
    pMan->nAlgorithm = nAlg;
    pMan->vPhase = vPhase;
    Vec_IntClear(vPhase);
}